

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kptr_(jit_State *J,IROp op,void *ptr)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint local_44;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  void *ptr_local;
  IROp op_local;
  jit_State *J_local;
  IRRef ref_1;
  
  pIVar2 = (J->cur).ir;
  uVar1 = J->chain[op];
  while (local_44 = (uint)uVar1, local_44 != 0) {
    if (pIVar2[(ulong)local_44 + 1] == (IRIns)ptr) goto LAB_001a4511;
    uVar1 = *(ushort *)((long)pIVar2 + (ulong)local_44 * 8 + 6);
  }
  local_44 = (J->cur).nk - 2;
  if (local_44 < J->irbotlim) {
    lj_ir_growbot(J);
  }
  (J->cur).nk = local_44;
  pIVar2 = (J->cur).ir + local_44;
  (pIVar2->field_1).op12 = 0;
  pIVar2[1] = (IRIns)ptr;
  (pIVar2->field_1).t.irt = '\t';
  (pIVar2->field_1).o = (IROp1)op;
  (pIVar2->field_0).prev = J->chain[op];
  J->chain[op] = (IRRef1)local_44;
LAB_001a4511:
  return local_44 + 0x9000000;
}

Assistant:

TRef lj_ir_kptr_(jit_State *J, IROp op, void *ptr)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
#if LJ_64 && !LJ_GC64
  lj_assertJ((void *)(uintptr_t)u32ptr(ptr) == ptr, "out-of-range GC pointer");
#endif
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_kptr(&cir[ref]) == ptr)
      goto found;
#if LJ_GC64
  ref = ir_nextk64(J);
#else
  ref = ir_nextk(J);
#endif
  ir = IR(ref);
  ir->op12 = 0;
  setmref(ir[LJ_GC64].ptr, ptr);
  ir->t.irt = IRT_PGC;
  ir->o = op;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, IRT_PGC);
}